

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O2

int ps_alignment_propagate(ps_alignment_t *al)

{
  ushort uVar1;
  ps_alignment_entry_t *ppVar2;
  long lVar3;
  ulong uVar4;
  ps_alignment_entry_t *ppVar5;
  ps_alignment_entry_t *ppVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  
  uVar1 = (al->state).n_ent;
  lVar3 = 0;
  ppVar6 = (ps_alignment_entry_t *)0x0;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    ppVar2 = (al->state).seq;
    ppVar5 = (al->sseq).seq + *(int *)((long)&ppVar2->parent + lVar3);
    if (ppVar5 == ppVar6) {
      uVar7._0_4_ = ppVar5->duration;
      uVar7._4_4_ = ppVar5->score;
    }
    else {
      ppVar5->start = *(int32 *)((long)&ppVar2->start + lVar3);
      ppVar5->duration = 0;
      ppVar5->score = 0;
      uVar7 = 0;
    }
    uVar8 = *(undefined8 *)((long)&ppVar2->duration + lVar3);
    ppVar5->duration = (int)uVar8 + (int)uVar7;
    ppVar5->score = (int)((ulong)uVar8 >> 0x20) + (int)((ulong)uVar7 >> 0x20);
    lVar3 = lVar3 + 0x1c;
    ppVar6 = ppVar5;
  }
  uVar1 = (al->sseq).n_ent;
  ppVar6 = (ps_alignment_entry_t *)0x0;
  for (lVar3 = 0; (ulong)uVar1 * 0x1c - lVar3 != 0; lVar3 = lVar3 + 0x1c) {
    ppVar2 = (al->sseq).seq;
    ppVar5 = (al->word).seq + *(int *)((long)&ppVar2->parent + lVar3);
    if (ppVar5 == ppVar6) {
      uVar8._0_4_ = ppVar5->duration;
      uVar8._4_4_ = ppVar5->score;
    }
    else {
      ppVar5->start = *(int32 *)((long)&ppVar2->start + lVar3);
      ppVar5->duration = 0;
      ppVar5->score = 0;
      uVar8 = 0;
    }
    uVar7 = *(undefined8 *)((long)&ppVar2->duration + lVar3);
    ppVar5->duration = (int)uVar7 + (int)uVar8;
    ppVar5->score = (int)((ulong)uVar7 >> 0x20) + (int)((ulong)uVar8 >> 0x20);
    ppVar6 = ppVar5;
  }
  return 0;
}

Assistant:

int
ps_alignment_propagate(ps_alignment_t *al)
{
    ps_alignment_entry_t *last_ent = NULL;
    int i;

    /* Propagate duration up from states to phones. */
    for (i = 0; i < al->state.n_ent; ++i) {
        ps_alignment_entry_t *sent = al->state.seq + i;
        ps_alignment_entry_t *pent = al->sseq.seq + sent->parent;
        if (pent != last_ent) {
            pent->start = sent->start;
            pent->duration = 0;
            pent->score = 0;
        }
        pent->duration += sent->duration;
        pent->score += sent->score;
        last_ent = pent;
    }

    /* Propagate duration up from phones to words. */
    last_ent = NULL;
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *went = al->word.seq + pent->parent;
        if (went != last_ent) {
            went->start = pent->start;
            went->duration = 0;
            went->score = 0;
        }
        went->duration += pent->duration;
        went->score += pent->score;
        last_ent = went;
    }

    return 0;
}